

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

bool __thiscall
pstore::command_line::
list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
::value(list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
        *this,string *v)

{
  bool bVar1;
  string *v_local;
  list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  *this_local;
  
  bVar1 = option::allow_comma_separated(&this->super_option);
  if (bVar1) {
    this_local._7_1_ = comma_separated(this,v);
  }
  else {
    this_local._7_1_ = simple_value(this,v);
  }
  return this_local._7_1_;
}

Assistant:

bool list<T, Parser>::value (std::string const & v) {
            if (this->allow_comma_separated ()) {
                return this->comma_separated (v);
            }

            return this->simple_value (v);
        }